

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void loadlc(int offset,int pos)

{
  int local_14;
  int i;
  int pos_local;
  int offset_local;
  
  if (pos == 0) {
    local_14 = 7;
    if (bank < 0xf0) {
      hexcon(2,bank,prlnbuf + 7);
    }
    else {
      prlnbuf[7] = '-';
      local_14 = 9;
      prlnbuf[8] = '-';
    }
    prlnbuf[local_14] = ':';
    i = page * 0x2000 + offset;
    local_14 = local_14 + 1;
  }
  else {
    local_14 = 0x10;
    i = offset;
  }
  hexcon(4,i,prlnbuf + local_14);
  return;
}

Assistant:

void
loadlc(int offset, int pos)
{
	int	i;

	if (pos)
		i = 16;
	else
		i = 7;

	if (pos == 0) {
		if (bank >= RESERVED_BANK) {
			prlnbuf[i++] = '-';
			prlnbuf[i++] = '-';
		}
		else {
			hexcon(2, bank, &prlnbuf[i]);
		}
		prlnbuf[i++] = ':';
		offset += page << 13;
	}
	hexcon(4, offset, &prlnbuf[i]);
}